

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

_Bool tlb_force_broadcast(CPUARMState_conflict *env)

{
  int iVar1;
  _Bool _Var2;
  
  if (((env->cp15).hcr_el2 & 0x200) == 0) {
    return false;
  }
  iVar1 = arm_current_el(env);
  if ((iVar1 == 1) && ((env->features & 0x200000000) != 0)) {
    _Var2 = ((env->cp15).scr_el3 & 1) == 0;
  }
  else {
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

static bool tlb_force_broadcast(CPUARMState *env)
{
    return (env->cp15.hcr_el2 & HCR_FB) &&
        arm_current_el(env) == 1 && arm_is_secure_below_el3(env);
}